

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cifras.cc
# Opt level: O3

int main(int argc,char **argv)

{
  char *pcVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> _Var4;
  iterator iVar5;
  char *pcVar6;
  char cVar7;
  size_t sVar8;
  long lVar9;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> _Var10;
  MemoryManager *this;
  clock_t cVar11;
  Node *pNVar12;
  clock_t cVar13;
  ostream *poVar14;
  int iVar15;
  void *__ptr;
  ulong uVar16;
  vector<long,_std::allocator<long>_> basics_v;
  list<long,_std::allocator<long>_> basics;
  long target;
  long number;
  char *endptr;
  set<std::__cxx11::list<long,_std::allocator<long>_>,_std::less<std::__cxx11::list<long,_std::allocator<long>_>_>,_std::allocator<std::__cxx11::list<long,_std::allocator<long>_>_>_>
  explored_nodes;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> local_c8;
  iterator iStack_c0;
  long *local_b8;
  _List_node_base local_a8;
  long local_90;
  long local_88;
  char *local_80;
  _List_node_base local_78;
  undefined8 local_68;
  _Rb_tree<std::__cxx11::list<long,_std::allocator<long>_>,_std::__cxx11::list<long,_std::allocator<long>_>,_std::_Identity<std::__cxx11::list<long,_std::allocator<long>_>_>,_std::less<std::__cxx11::list<long,_std::allocator<long>_>_>,_std::allocator<std::__cxx11::list<long,_std::allocator<long>_>_>_>
  local_60;
  
  local_c8._M_current = (long *)0x0;
  iStack_c0._M_current = (long *)0x0;
  local_b8 = (long *)0x0;
  if (argc < 4) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Usage: ",7);
    pcVar1 = *argv;
    if (pcVar1 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x10a130);
    }
    else {
      sVar8 = strlen(pcVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar1,sVar8);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr," num num... target",0x12);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '0');
    std::ostream::put('0');
    iVar15 = -1;
    std::ostream::flush();
  }
  else {
    uVar16 = 1;
    do {
      lVar9 = strtol(argv[uVar16],&local_80,0);
      pcVar6 = local_80;
      pcVar1 = argv[uVar16];
      local_88 = lVar9;
      sVar8 = strlen(pcVar1);
      if (pcVar6 != pcVar1 + sVar8) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error: \"",8);
        pcVar1 = argv[uVar16];
        if (pcVar1 == (char *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x10a130);
        }
        else {
          sVar8 = strlen(pcVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar1,sVar8);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"\" not a number.",0xf);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '0');
        std::ostream::put('0');
        iVar15 = -2;
        std::ostream::flush();
        goto LAB_00104879;
      }
      if (lVar9 < 1) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Error: numbers below or equal to zero are not allowed.",
                   0x36);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '0');
        std::ostream::put('0');
        iVar15 = -3;
        std::ostream::flush();
        goto LAB_00104879;
      }
      if (iStack_c0._M_current == local_b8) {
        std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                  ((vector<long,std::allocator<long>> *)&local_c8,iStack_c0,&local_88);
      }
      else {
        *iStack_c0._M_current = lVar9;
        iStack_c0._M_current = iStack_c0._M_current + 1;
      }
      uVar16 = uVar16 + 1;
    } while ((uint)argc != uVar16);
    local_90 = iStack_c0._M_current[-1];
    iStack_c0._M_current = iStack_c0._M_current + -1;
    _Var10 = std::
             __find_if<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__ops::_Iter_equals_val<long_const>>
                       (local_c8._M_current);
    iVar5._M_current = iStack_c0._M_current;
    _Var4._M_current = local_c8._M_current;
    if (_Var10._M_current == iStack_c0._M_current) {
      if (local_c8._M_current != _Var10._M_current) {
        uVar16 = (long)_Var10._M_current - (long)local_c8._M_current >> 3;
        lVar9 = 0x3f;
        if (uVar16 != 0) {
          for (; uVar16 >> lVar9 == 0; lVar9 = lVar9 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<long>>>
                  (local_c8._M_current,iStack_c0._M_current,((uint)lVar9 ^ 0x3f) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::greater<long>>>
                  (_Var4._M_current,iVar5._M_current);
      }
      std::__cxx11::list<long,std::allocator<long>>::
      list<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,void>
                ((list<long,std::allocator<long>> *)&local_a8,local_c8,
                 (__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>)
                 iStack_c0._M_current,(allocator_type *)&local_60);
      this = MemoryManager::instance();
      local_60._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_60._M_impl.super__Rb_tree_header._M_header;
      local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_60._M_impl.super__Rb_tree_header._M_header._M_right =
           local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      cVar11 = clock();
      local_68 = 0;
      local_78._M_next = &local_78;
      local_78._M_prev = &local_78;
      pNVar12 = MemoryManager::build_node
                          (this,(list<const_Operation_*,_std::allocator<const_Operation_*>_> *)
                                &local_78,0,local_90,(list<long,_std::allocator<long>_> *)&local_a8,
                           (set<std::__cxx11::list<long,_std::allocator<long>_>,_std::less<std::__cxx11::list<long,_std::allocator<long>_>_>,_std::allocator<std::__cxx11::list<long,_std::allocator<long>_>_>_>
                            *)&local_60,(Node *)0x0);
      p_Var3 = local_78._M_next;
      while (p_Var3 != &local_78) {
        p_Var2 = (((_List_base<const_Operation_*,_std::allocator<const_Operation_*>_> *)
                  &p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
        operator_delete(p_Var3,0x18);
        p_Var3 = p_Var2;
      }
      cVar13 = clock();
      operator<<((ostream *)&std::cout,pNVar12->best_child);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Elapsed time: ",0xe)
      ;
      poVar14 = std::ostream::_M_insert<double>((double)(cVar13 - cVar11) / 1000000.0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14," seconds",8);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
      std::ostream::put((char)poVar14);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Explored nodes: ",0x10);
      poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      cVar7 = std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
      __ptr = (void *)(ulong)(uint)(int)cVar7;
      std::ostream::put((char)poVar14);
      std::ostream::flush();
      MemoryManager::free(this,__ptr);
      std::
      _Rb_tree<std::__cxx11::list<long,_std::allocator<long>_>,_std::__cxx11::list<long,_std::allocator<long>_>,_std::_Identity<std::__cxx11::list<long,_std::allocator<long>_>_>,_std::less<std::__cxx11::list<long,_std::allocator<long>_>_>,_std::allocator<std::__cxx11::list<long,_std::allocator<long>_>_>_>
      ::~_Rb_tree(&local_60);
      while (local_a8._M_next != &local_a8) {
        p_Var3 = (((_List_base<long,_std::allocator<long>_> *)&(local_a8._M_next)->_M_next)->_M_impl
                 )._M_node.super__List_node_base._M_next;
        operator_delete(local_a8._M_next,0x18);
        local_a8._M_next = p_Var3;
      }
      iVar15 = 0;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Error: target present in numbers to operate.",0x2c);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '0');
      std::ostream::put('0');
      iVar15 = -4;
      std::ostream::flush();
    }
  }
LAB_00104879:
  if (local_c8._M_current != (long *)0x0) {
    operator_delete(local_c8._M_current,(long)local_b8 - (long)local_c8._M_current);
  }
  return iVar15;
}

Assistant:

int main(int argc, char *argv[])
{
	vector<long> basics_v;
	char *endptr;
	long number;
	
	// Check number of arguments.
	if (argc < 4) {
		cerr << "Usage: " << argv[0] << " num num... target" << endl;
		return -1;
	}

	// Get number list, checking argument format.
	for (int ii = 1; ii < argc; ++ii) {
		number = strtol(argv[ii], &endptr, 0);

		if (endptr != argv[ii] + strlen(argv[ii])) {
			cerr << "Error: \"" << argv[ii] << "\" not a number."
									<< endl;
			return -2;
		}
		
		if (number <= 0) {
			cerr << "Error: numbers below or equal to zero are not "
							     "allowed." << endl;
			return -3;
		}

		basics_v.push_back(number);
	}

	// Separate target.
	long target = basics_v.back();
	basics_v.pop_back();

	// Check target not in numbers.
	if (find(basics_v.begin(), basics_v.end(), target) != basics_v.end()) {
		cerr << "Error: target present in numbers to operate." << endl;
		return -4;
	}

	// Sort initial numbers and change to list.
	sort(basics_v.begin(), basics_v.end(), greater<long>());
	list<long> basics(basics_v.begin(), basics_v.end());

	// Execution.
	MemoryManager *mm = MemoryManager::instance();
	set<list<long> > explored_nodes;
	clock_t before = clock();
	Node *root = mm->build_node(list<const Operation *>(), 0L, target,
				    basics, explored_nodes, 0);
	clock_t after = clock();
	
	// Print results.
	cout << root->best();
	double clocks = static_cast<double>(after - before);
	double cps = static_cast<double>(CLOCKS_PER_SEC);
	cout << "Elapsed time: " << (clocks / cps) << " seconds" << endl;
	cout << "Explored nodes: " << explored_nodes.size() << endl;

	// Free memory.
	mm->free();
		
	return 0;
}